

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * __thiscall
QUtil::toUTF16_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,unsigned_long uval)

{
  int iVar1;
  uint uVar2;
  ushort *local_38;
  undefined8 local_30;
  ushort local_28;
  undefined1 uStack_26;
  undefined1 uStack_25;
  uint uStack_24;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 0xfffffffffffff800) == 0xd800) {
LAB_00243d25:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x28387b);
  }
  else {
    uVar2 = (uint)this;
    if (this < (QUtil *)0x10000) {
      local_28 = (ushort)(uVar2 << 8) | (ushort)((ulong)this >> 8);
      local_30 = 2;
      uStack_26 = 0;
    }
    else {
      if ((QUtil *)((long)&__DT_RELA[0x7f7].r_offset + 7) < this) goto LAB_00243d25;
      iVar1 = (uVar2 + 0xf0000 >> 2 & 0xff00 | (uVar2 & 0x300) << 8 | uVar2 << 0x18) +
              (uVar2 + 0xf0000 >> 0x12 & 3) + 0xdc00d8;
      local_28 = (ushort)iVar1;
      uStack_26 = (undefined1)((uint)iVar1 >> 0x10);
      uStack_25 = (undefined1)((uint)iVar1 >> 0x18);
      local_30 = 4;
      uStack_24 = uStack_24 & 0xffffff00;
    }
    local_38 = &local_28;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT44(uStack_24,CONCAT13(uStack_25,CONCAT12(uStack_26,local_28)))
                               + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::toUTF16(unsigned long uval)
{
    std::string result;
    if ((uval >= 0xd800) && (uval <= 0xdfff)) {
        result = "\xff\xfd";
    } else if (uval <= 0xffff) {
        char out[2];
        out[0] = static_cast<char>((uval & 0xff00) >> 8);
        out[1] = static_cast<char>(uval & 0xff);
        result = std::string(out, 2);
    } else if (uval <= 0x10ffff) {
        char out[4];
        uval -= 0x10000;
        unsigned short high = static_cast<unsigned short>(((uval & 0xffc00) >> 10) + 0xd800);
        unsigned short low = static_cast<unsigned short>((uval & 0x3ff) + 0xdc00);
        out[0] = static_cast<char>((high & 0xff00) >> 8);
        out[1] = static_cast<char>(high & 0xff);
        out[2] = static_cast<char>((low & 0xff00) >> 8);
        out[3] = static_cast<char>(low & 0xff);
        result = std::string(out, 4);
    } else {
        result = "\xff\xfd";
    }

    return result;
}